

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

int __thiscall cs_impl::string_cs_ext::tolower(string_cs_ext *this,int __c)

{
  bool bVar1;
  reference pcVar2;
  undefined4 in_register_00000034;
  char *ch;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string s;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  string_cs_ext *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined8 local_38;
  string local_30 [32];
  undefined8 local_10;
  string_cs_ext *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__c);
  this_00 = this;
  local_8 = this;
  std::__cxx11::string::string(local_30);
  local_38 = local_10;
  local_40._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this_00,in_stack_ffffffffffffff88);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_40);
    ::tolower((int)*pcVar2);
    std::__cxx11::string::push_back((char)local_30);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_40);
  }
  std::__cxx11::string::string((string *)this_00,local_30);
  std::__cxx11::string::~string(local_30);
  return (int)this;
}

Assistant:

string tolower(const string &str)
		{
			string s;
			for (auto &ch: str)
				s.push_back(std::tolower(ch));
			return std::move(s);
		}